

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltm.c
# Opt level: O1

char * raviT_objtypename(lua_State *L,TValue *o)

{
  byte bVar1;
  GCObject *pGVar2;
  TString *key;
  TValue *n;
  TString *pTVar3;
  char *pcVar4;
  ushort uVar5;
  size_t sVar6;
  
  uVar5 = o->tt_;
  if (uVar5 < 0x8015) {
    if (uVar5 != 0x8005) {
LAB_00123a14:
      if (uVar5 != 0x8007) goto LAB_00123b2a;
      pTVar3 = (TString *)(o->value_).f;
      if (pTVar3->tt != '\a') {
        __assert_fail("(((o)->value_).gc)->tt == 7",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltm.c"
                      ,0x71,"const char *raviT_objtypename(lua_State *, const TValue *)");
      }
      sVar6 = (pTVar3->u).lnglen;
      goto joined_r0x00123a76;
    }
    pTVar3 = (TString *)(o->value_).gc;
    if (pTVar3->tt != '\x05') {
      __assert_fail("(((o)->value_).gc)->tt == 5",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltm.c"
                    ,0x70,"const char *raviT_objtypename(lua_State *, const TValue *)");
    }
    sVar6 = pTVar3[1].u.lnglen;
    if (sVar6 == 0) goto LAB_00123a14;
  }
  else {
    if ((uVar5 != 0x8015) && (uVar5 != 0x8025)) goto LAB_00123b2a;
    pGVar2 = (o->value_).gc;
    bVar1 = pGVar2->tt;
    pTVar3 = (TString *)(ulong)bVar1;
    if ((bVar1 != 0x15) && (bVar1 != 0x25)) {
      __assert_fail("((((o)->value_).gc)->tt == ((5) | ((1) << 4)) || (((o)->value_).gc)->tt == ((5) | ((2) << 4)))"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltm.c"
                    ,0x72,"const char *raviT_objtypename(lua_State *, const TValue *)");
    }
    sVar6._0_1_ = pGVar2[3].tt;
    sVar6._1_1_ = pGVar2[3].marked;
    sVar6._2_6_ = *(undefined6 *)&pGVar2[3].field_0xa;
joined_r0x00123a76:
    if (sVar6 == 0) goto LAB_00123b2a;
  }
  key = luaS_new(L,"__name");
  if (key->tt != '\x04') {
    __assert_fail("key->tt == ((4) | ((0) << 4))",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.h"
                  ,0x5a,"const TValue *luaH_getshortstr(Table *, TString *)");
  }
  n = (TValue *)((ulong)(*(uint *)(sVar6 + 0x38) & key->hash) * 0x20 + *(long *)(sVar6 + 0x18));
  if ((((Node *)n)->i_key).nk.tt_ == 0x8004) {
    pTVar3 = (TString *)(((Node *)n)->i_key).nk.value_.gc;
    if ((pTVar3->tt & 0xf) != 4) {
      pcVar4 = "(((((k)->value_).gc)->tt) & 0x0F) == 4";
LAB_00123bb2:
      __assert_fail(pcVar4,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.h"
                    ,0x5c,"const TValue *luaH_getshortstr(Table *, TString *)");
    }
    if (pTVar3->tt != 4) {
      pcVar4 = 
      "((((void) sizeof (((((((((k))->tt_)) & 0x0F)) == (4))) ? 1 : 0), __extension__ ({ if ((((((((k))->tt_)) & 0x0F)) == (4))) ; else __assert_fail (\"(((((((k))->tt_)) & 0x0F)) == (4))\", \"/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.h\", 92, __extension__ __PRETTY_FUNCTION__); })), ((((void) sizeof (((((((k)->value_).gc)->tt) & 0x0F) == 4) ? 1 : 0), __extension__ ({ if ((((((k)->value_).gc)->tt) & 0x0F) == 4) ; else __assert_fail (\"(((((k)->value_).gc)->tt) & 0x0F) == 4\", \"/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.h\", 92, __extension__ __PRETTY_FUNCTION__); })), (&((((union GCUnion *)((((k)->value_).gc))))->ts))))))->tt == ((4) | ((0) << 4))"
      ;
      goto LAB_00123bb2;
    }
    if (pTVar3 != key) goto LAB_00123aec;
  }
  else {
LAB_00123aec:
    if ((((Node *)n)->i_key).nk.next == 0) {
      n = &luaO_nilobject_;
    }
    else {
      n = luaH_getshortstr_continue(key,(Node *)n);
    }
  }
  uVar5 = (((Node *)n)->i_val).tt_ & 0xf;
  if (uVar5 == 4) {
    pGVar2 = (((Node *)n)->i_val).value_.gc;
    if ((pGVar2->tt & 0xf) != 4) {
      __assert_fail("(((((name)->value_).gc)->tt) & 0x0F) == 4",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltm.c"
                    ,0x75,"const char *raviT_objtypename(lua_State *, const TValue *)");
    }
    pTVar3 = (TString *)&pGVar2[1].tt;
  }
  if (uVar5 == 4) {
    return (char *)pTVar3;
  }
LAB_00123b2a:
  uVar5 = o->tt_;
  if (uVar5 == 0x8015) {
    pcVar4 = "integer[]";
  }
  else if (uVar5 == 0x8025) {
    pcVar4 = "number[]";
  }
  else {
    pcVar4 = luaT_typenames_[(ulong)(uVar5 & 0xf) + 1];
  }
  return pcVar4;
}

Assistant:

const char *raviT_objtypename(lua_State *L, const TValue *o) {
  Table *mt;
  if ((ttisLtable(o) && (mt = hvalue(o)->metatable) != NULL) ||
    (ttisfulluserdata(o) && (mt = uvalue(o)->metatable) != NULL) ||
    (ttisarray(o) && (mt = arrvalue(o)->metatable) != NULL)) {
    const TValue *name = luaH_getshortstr(mt, luaS_new(L, "__name"));
    if (ttisstring(name))  /* is '__name' a string? */
      return getstr(tsvalue(name));  /* use it as type name */
  }
  if (ttisiarray(o)) return "integer[]";
  else if (ttisfarray(o)) return "number[]";
  else return ttypename(ttnov(o));  /* else use standard type name */
}